

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_log_write(hdr_log_writer *writer,FILE *file,hdr_timespec *start_timestamp,
                 hdr_timespec *end_timestamp,hdr_histogram *histogram)

{
  hdr_timespec *__stream;
  int iVar1;
  int iVar2;
  size_t output_len;
  int64_t iVar3;
  double dVar4;
  double dVar5;
  size_t encoded_len;
  int result;
  int rc;
  char *encoded_histogram;
  size_t compressed_len;
  uint8_t *compressed_histogram;
  hdr_histogram *histogram_local;
  hdr_timespec *end_timestamp_local;
  hdr_timespec *start_timestamp_local;
  FILE *file_local;
  hdr_log_writer *writer_local;
  
  compressed_len = 0;
  encoded_histogram = (char *)0x0;
  _result = (char *)0x0;
  encoded_len._0_4_ = 0;
  compressed_histogram = (uint8_t *)histogram;
  histogram_local = (hdr_histogram *)end_timestamp;
  end_timestamp_local = start_timestamp;
  start_timestamp_local = (hdr_timespec *)file;
  file_local = (FILE *)writer;
  iVar1 = hdr_encode_compressed(histogram,(uint8_t **)&compressed_len,(size_t *)&encoded_histogram);
  if (iVar1 == 0) {
    output_len = hdr_base64_encoded_len((size_t)encoded_histogram);
    _result = (char *)calloc(output_len + 1,1);
    iVar1 = hdr_base64_encode((uint8_t *)compressed_len,(size_t)encoded_histogram,_result,output_len
                             );
    __stream = start_timestamp_local;
    if (iVar1 == 0) {
      dVar4 = hdr_timespec_as_double(end_timestamp_local);
      dVar5 = hdr_timespec_as_double((hdr_timespec *)histogram_local);
      iVar3 = hdr_max((hdr_histogram *)compressed_histogram);
      iVar2 = fprintf((FILE *)__stream,"%.3f,%.3f,%lu.0,%s\n",dVar4,dVar5,iVar3,_result);
      iVar1 = (int)encoded_len;
      if (iVar2 < 0) {
        encoded_len._0_4_ = 5;
        iVar1 = (int)encoded_len;
      }
    }
  }
  encoded_len._0_4_ = iVar1;
  free((void *)compressed_len);
  free(_result);
  return (int)encoded_len;
}

Assistant:

int hdr_log_write(
    struct hdr_log_writer* writer,
    FILE* file,
    const hdr_timespec* start_timestamp,
    const hdr_timespec* end_timestamp,
    struct hdr_histogram* histogram)
{
    uint8_t* compressed_histogram = NULL;
    size_t compressed_len = 0;
    char* encoded_histogram = NULL;
    int rc = 0;
    int result = 0;
    size_t encoded_len;

    (void)writer;

    rc = hdr_encode_compressed(histogram, &compressed_histogram, &compressed_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    encoded_len = hdr_base64_encoded_len(compressed_len);
    encoded_histogram = (char*) hdr_calloc(encoded_len + 1, sizeof(char));

    rc = hdr_base64_encode(
        compressed_histogram, compressed_len, encoded_histogram, encoded_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    if (fprintf(
        file, "%.3f,%.3f,%" PRIu64 ".0,%s\n",
        hdr_timespec_as_double(start_timestamp),
        hdr_timespec_as_double(end_timestamp),
        hdr_max(histogram),
        encoded_histogram) < 0)
    {
        result = EIO;
    }

cleanup:
    hdr_free(compressed_histogram);
    hdr_free(encoded_histogram);

    return result;
}